

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O2

void __thiscall Jzon::Parser::readString(Parser *this,istream *stream,DataQueue *data)

{
  undefined1 uVar1;
  int iVar2;
  undefined1 local_80 [40];
  size_type *local_58;
  string str;
  char c2;
  
  local_58 = &str._M_string_length;
  str._M_dataplus._M_p = (pointer)0x0;
  str._M_string_length._0_1_ = 0;
  str.field_2._M_local_buf[0xf] = '\0';
  while( true ) {
    uVar1 = str.field_2._M_local_buf[0xf];
    iVar2 = std::istream::peek();
    if (iVar2 == -1) break;
    std::istream::get((char *)stream);
    if (uVar1 != '\\' && str.field_2._M_local_buf[0xf] == '\"') break;
    std::__cxx11::string::push_back((char)&local_58);
  }
  local_80._0_4_ = T_STRING;
  std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_58);
  std::
  deque<std::pair<Jzon::Node::Type,std::__cxx11::string>,std::allocator<std::pair<Jzon::Node::Type,std::__cxx11::string>>>
  ::emplace_back<std::pair<Jzon::Node::Type,std::__cxx11::string>>
            ((deque<std::pair<Jzon::Node::Type,std::__cxx11::string>,std::allocator<std::pair<Jzon::Node::Type,std::__cxx11::string>>>
              *)data,(pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Parser::readString(std::istream &stream, DataQueue &data)
	{
		std::string str;

		char c1 = '\0', c2 = '\0';
		while (stream.peek() != std::char_traits<char>::eof())
		{
			stream.get(c2);

			if (c1 != '\\' && c2 == '"')
			{
				break;
			}

			str += c2;

			c1 = c2;
		}

		data.push(std::make_pair(Node::T_STRING, str));
	}